

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_mtrie_impl.hpp
# Opt level: O3

void __thiscall
zmq::generic_mtrie_t<zmq::pipe_t>::rm<zmq::xpub_t*>
          (generic_mtrie_t<zmq::pipe_t> *this,value_t *pipe_,
          _func_void_uchar_ptr_size_t_xpub_t_ptr *func_,xpub_t *arg_,bool call_on_uniq_)

{
  short *psVar1;
  undefined1 uVar2;
  char cVar3;
  ushort uVar4;
  undefined2 uVar5;
  short sVar6;
  ushort uVar7;
  generic_mtrie_t<zmq::pipe_t> *pgVar8;
  _List_node_base *p_Var9;
  undefined8 ******ppppppuVar10;
  char cVar11;
  undefined8 ******ppppppuVar12;
  undefined8 *****pppppuVar13;
  long lVar14;
  bool bVar15;
  byte bVar16;
  byte bVar17;
  _List_node_base *p_Var18;
  _List_node_base *p_Var19;
  uint uVar20;
  _List_node_base *p_Var21;
  undefined7 in_register_00000081;
  uint uVar22;
  ulong uVar23;
  byte bVar24;
  size_t __size;
  pair<std::_Rb_tree_iterator<zmq::pipe_t_*>,_std::_Rb_tree_iterator<zmq::pipe_t_*>_> pVar25;
  list<zmq::generic_mtrie_t<zmq::pipe_t>::iter,_std::allocator<zmq::generic_mtrie_t<zmq::pipe_t>::iter>_>
  stack;
  uint local_9c;
  uchar *local_98;
  undefined8 *****local_90;
  undefined8 *****local_88;
  long local_80;
  ulong local_78;
  uint uStack_6c;
  _List_node_base *local_68;
  _List_node_base *local_60;
  undefined4 local_54;
  _List_node_base *local_50;
  _func_void_uchar_ptr_size_t_xpub_t_ptr *local_48;
  xpub_t *local_40;
  value_t *local_38;
  
  local_54 = (undefined4)CONCAT71(in_register_00000081,call_on_uniq_);
  local_80 = 0;
  local_90 = &local_90;
  local_88 = &local_90;
  local_38 = pipe_;
  p_Var18 = (_List_node_base *)operator_new(0x38);
  p_Var18[1]._M_next = (_List_node_base *)this;
  p_Var18[1]._M_prev = (_List_node_base *)0x0;
  p_Var18[2]._M_next = (_List_node_base *)0x0;
  *(undefined8 *)((long)&p_Var18[2]._M_next + 5) = 0;
  *(undefined8 *)((long)&p_Var18[2]._M_prev + 5) = 0;
  std::__detail::_List_node_base::_M_hook(p_Var18);
  local_80 = local_80 + 1;
  if ((undefined8 ******)local_90 == &local_90) {
    local_98 = (uchar *)0x0;
    lVar14 = local_80;
  }
  else {
    local_98 = (uchar *)0x0;
    local_50 = (_List_node_base *)0x0;
    local_48 = func_;
    local_40 = arg_;
    do {
      local_80 = local_80 + -1;
      while( true ) {
        pppppuVar13 = local_88;
        p_Var18 = (_List_node_base *)local_88[2];
        local_68 = (_List_node_base *)local_88[3];
        local_60 = (_List_node_base *)local_88[4];
        p_Var21 = (_List_node_base *)local_88[5];
        uVar4 = *(ushort *)(local_88 + 6);
        uVar23 = (ulong)uVar4;
        bVar16 = *(byte *)((long)local_88 + 0x32);
        bVar24 = *(byte *)((long)local_88 + 0x33);
        uVar5 = *(undefined2 *)((long)local_88 + 0x35);
        bVar17 = *(byte *)((long)local_88 + 0x34);
        uVar2 = *(undefined1 *)((long)local_88 + 0x37);
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(pppppuVar13,0x38);
        local_9c = (uint)bVar24;
        uStack_6c = (uint)bVar24;
        local_78 = uVar23;
        if ((bVar17 & 1) == 0) break;
        sVar6 = *(short *)((long)&p_Var18->_M_prev + 2);
        if (sVar6 == 0) goto LAB_001e3084;
        if (sVar6 == 1) {
          bVar15 = is_redundant((generic_mtrie_t<zmq::pipe_t> *)p_Var18[1]._M_next);
          if (bVar15) {
            pgVar8 = (generic_mtrie_t<zmq::pipe_t> *)p_Var18[1]._M_next;
            if (pgVar8 != (generic_mtrie_t<zmq::pipe_t> *)0x0) {
              ~generic_mtrie_t(pgVar8);
            }
            operator_delete(pgVar8,0x18);
            p_Var18[1]._M_next = (_List_node_base *)0x0;
            *(undefined2 *)((long)&p_Var18->_M_prev + 2) = 0;
            psVar1 = (short *)((long)&p_Var18->_M_prev + 4);
            *psVar1 = *psVar1 + -1;
            if (*psVar1 != 0) {
              fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.node->_live_nodes == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                      ,0x116);
              fflush(_stderr);
              zmq_abort("it.node->_live_nodes == 0");
            }
          }
          goto LAB_001e3084;
        }
        pgVar8 = (generic_mtrie_t<zmq::pipe_t> *)(&(p_Var18[1]._M_next)->_M_next)[uVar23];
        if (pgVar8 == (generic_mtrie_t<zmq::pipe_t> *)0x0) {
          uVar23 = (ulong)bVar16;
        }
        else {
          bVar15 = is_redundant(pgVar8);
          if (bVar15) {
            pgVar8 = (generic_mtrie_t<zmq::pipe_t> *)(&(p_Var18[1]._M_next)->_M_next)[local_78];
            if (pgVar8 != (generic_mtrie_t<zmq::pipe_t> *)0x0) {
              ~generic_mtrie_t(pgVar8);
            }
            operator_delete(pgVar8,0x18);
            (&(p_Var18[1]._M_next)->_M_next)[local_78] = (_List_node_base *)0x0;
            sVar6 = *(short *)((long)&p_Var18->_M_prev + 4);
            if (sVar6 == 0) {
              fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.node->_live_nodes > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                      ,0x123);
              fflush(_stderr);
              zmq_abort("it.node->_live_nodes > 0");
              sVar6 = *(short *)((long)&p_Var18->_M_prev + 4);
            }
            uVar23 = (ulong)bVar16;
            *(short *)((long)&p_Var18->_M_prev + 4) = sVar6 + -1;
          }
          else {
            local_9c = (uint)*(byte *)&p_Var18->_M_prev + (int)local_78;
            uVar20 = (uint)bVar16;
            if (local_9c < bVar16) {
              uVar20 = local_9c;
            }
            if (local_9c <= uStack_6c) {
              local_9c = uStack_6c;
            }
            uVar23 = (ulong)uVar20;
          }
        }
        uVar7 = *(ushort *)((long)&p_Var18->_M_prev + 2);
        bVar24 = (byte)uVar23;
        bVar16 = (byte)local_9c;
        if (uVar7 <= (ushort)(uVar4 + 1)) {
          if (uVar7 < 2) {
            fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.node->_count > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                    ,0x147);
            fflush(_stderr);
            zmq_abort("it.node->_count > 1");
          }
          sVar6 = *(short *)((long)&p_Var18->_M_prev + 4);
          if (sVar6 == 1) {
            if (bVar24 != bVar16) {
              fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.new_min == it.new_max",
                      "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                      ,0x156);
              fflush(_stderr);
              zmq_abort("it.new_min == it.new_max");
            }
            bVar16 = *(byte *)&p_Var18->_M_prev;
            if (bVar24 < bVar16) {
              fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.new_min >= it.node->_min",
                      "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                      ,0x157);
              fflush(_stderr);
              zmq_abort("it.new_min >= it.node->_min");
              bVar16 = *(byte *)&p_Var18->_M_prev;
            }
            if ((uint)*(ushort *)((long)&p_Var18->_M_prev + 2) + (uint)bVar16 <=
                (uint)(uVar23 & 0xff)) {
              fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                      "it.new_min < it.node->_min + it.node->_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                      ,0x159);
              fflush(_stderr);
              zmq_abort("it.new_min < it.node->_min + it.node->_count");
              bVar16 = *(byte *)&p_Var18->_M_prev;
            }
            p_Var21 = p_Var18[1]._M_next;
            p_Var19 = *(_List_node_base **)((long)p_Var21 + ((uVar23 & 0xff) - (ulong)bVar16) * 8);
            if (p_Var19 == (_List_node_base *)0x0) {
              fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","node",
                      "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                      ,0x15e);
              fflush(_stderr);
              zmq_abort("node");
              p_Var21 = p_Var18[1]._M_next;
            }
            free(p_Var21);
            p_Var18[1]._M_next = p_Var19;
            *(undefined2 *)((long)&p_Var18->_M_prev + 2) = 1;
            *(byte *)&p_Var18->_M_prev = bVar24;
          }
          else if (sVar6 == 0) {
            free(p_Var18[1]._M_next);
            p_Var18[1]._M_next = (_List_node_base *)0x0;
            *(undefined2 *)((long)&p_Var18->_M_prev + 2) = 0;
          }
          else {
            bVar17 = *(byte *)&p_Var18->_M_prev;
            if ((bVar17 < bVar24) ||
               ((int)(local_9c & 0xff) <
                (int)((uint)bVar17 + (uint)*(ushort *)((long)&p_Var18->_M_prev + 2) + -1))) {
              if (bVar16 <= bVar24) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.new_max - it.new_min + 1 > 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x16a);
                fflush(_stderr);
                zmq_abort("it.new_max - it.new_min + 1 > 1");
                bVar17 = *(byte *)&p_Var18->_M_prev;
              }
              p_Var21 = p_Var18[1]._M_next;
              local_9c = local_9c & 0xff;
              if ((bVar24 <= bVar17) &&
                 ((int)((uint)bVar17 + (uint)*(ushort *)((long)&p_Var18->_M_prev + 2) + -1) <=
                  (int)local_9c)) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                        "it.new_min > it.node->_min || it.new_max < it.node->_min + it.node->_count - 1"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x171);
                fflush(_stderr);
                zmq_abort(
                         "it.new_min > it.node->_min || it.new_max < it.node->_min + it.node->_count - 1"
                         );
                bVar17 = *(byte *)&p_Var18->_M_prev;
              }
              if (bVar24 < bVar17) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","it.new_min >= it.node->_min",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x172);
                fflush(_stderr);
                zmq_abort("it.new_min >= it.node->_min");
                bVar17 = *(byte *)&p_Var18->_M_prev;
              }
              uVar4 = *(ushort *)((long)&p_Var18->_M_prev + 2);
              if ((uint)bVar17 + (uint)uVar4 <= local_9c) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                        "it.new_max <= it.node->_min + it.node->_count - 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x175);
                fflush(_stderr);
                zmq_abort("it.new_max <= it.node->_min + it.node->_count - 1");
                uVar4 = *(ushort *)((long)&p_Var18->_M_prev + 2);
              }
              uVar22 = (uint)uVar23 & 0xff;
              uVar20 = (local_9c - uVar22) + 1;
              if ((int)(uint)uVar4 <= (int)uVar20) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                        "it.new_max - it.new_min + 1 < it.node->_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x177);
                fflush(_stderr);
                zmq_abort("it.new_max - it.new_min + 1 < it.node->_count");
              }
              *(short *)((long)&p_Var18->_M_prev + 2) = (short)uVar20;
              __size = (size_t)((uVar20 & 0xffff) << 3);
              p_Var19 = (_List_node_base *)malloc(__size);
              p_Var18[1]._M_next = p_Var19;
              if (p_Var19 == (_List_node_base *)0x0) {
                fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                        ,0x17f);
                fflush(_stderr);
                zmq_abort("FATAL ERROR: OUT OF MEMORY");
                p_Var19 = p_Var18[1]._M_next;
                __size = (ulong)*(ushort *)((long)&p_Var18->_M_prev + 2) << 3;
              }
              memmove(p_Var19,(void *)(((ulong)uVar22 - (ulong)*(byte *)&p_Var18->_M_prev) * 8 +
                                      (long)p_Var21),__size);
              free(p_Var21);
              *(byte *)&p_Var18->_M_prev = bVar24;
            }
          }
          goto LAB_001e3084;
        }
        p_Var19 = (_List_node_base *)operator_new(0x38);
        p_Var19[1]._M_next = p_Var18;
        p_Var19[1]._M_prev = local_68;
        p_Var19[2]._M_next = local_60;
        p_Var19[2]._M_prev = p_Var21;
        *(ushort *)&p_Var19[3]._M_next = uVar4 + 1;
        *(byte *)((long)&p_Var19[3]._M_next + 2) = bVar24;
        *(byte *)((long)&p_Var19[3]._M_next + 3) = bVar16;
        *(undefined1 *)((long)&p_Var19[3]._M_next + 4) = 0;
        *(undefined2 *)((long)&p_Var19[3]._M_next + 5) = uVar5;
        *(undefined1 *)((long)&p_Var19[3]._M_next + 7) = uVar2;
        std::__detail::_List_node_base::_M_hook(p_Var19);
        lVar14 = local_80 + 1;
        if ((undefined8 ******)local_90 == &local_90) goto LAB_001e3444;
      }
      p_Var19 = p_Var18->_M_next;
      if (p_Var19 != (_List_node_base *)0x0) {
        pVar25 = std::
                 _Rb_tree<zmq::pipe_t_*,_zmq::pipe_t_*,_std::_Identity<zmq::pipe_t_*>,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
                 ::equal_range((_Rb_tree<zmq::pipe_t_*,_zmq::pipe_t_*,_std::_Identity<zmq::pipe_t_*>,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
                                *)p_Var19,&local_38);
        p_Var9 = p_Var19[2]._M_prev;
        std::
        _Rb_tree<zmq::pipe_t_*,_zmq::pipe_t_*,_std::_Identity<zmq::pipe_t_*>,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
        ::_M_erase_aux((_Rb_tree<zmq::pipe_t_*,_zmq::pipe_t_*,_std::_Identity<zmq::pipe_t_*>,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
                        *)p_Var19,(_Base_ptr)pVar25.first._M_node,(_Base_ptr)pVar25.second._M_node);
        if ((p_Var9 != p_Var19[2]._M_prev) &&
           (((char)local_54 == '\0' || (p_Var18->_M_next[2]._M_prev == (_List_node_base *)0x0)))) {
          (*local_48)(local_98,(size_t)p_Var21,local_40);
          p_Var19 = p_Var18->_M_next;
          if (p_Var19[2]._M_prev == (_List_node_base *)0x0) {
            std::
            _Rb_tree<zmq::pipe_t_*,_zmq::pipe_t_*,_std::_Identity<zmq::pipe_t_*>,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
            ::~_Rb_tree((_Rb_tree<zmq::pipe_t_*,_zmq::pipe_t_*,_std::_Identity<zmq::pipe_t_*>,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
                         *)p_Var19);
            operator_delete(p_Var19,0x30);
            p_Var18->_M_next = (_List_node_base *)0x0;
          }
        }
      }
      if (local_50 <= p_Var21) {
        local_50 = p_Var21 + 0x10;
        local_98 = (uchar *)realloc(local_98,(size_t)local_50);
        if (local_98 == (uchar *)0x0) {
          fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/generic_mtrie_impl.hpp"
                  ,0xca);
          fflush(_stderr);
          zmq_abort("FATAL ERROR: OUT OF MEMORY");
          local_98 = (uchar *)0x0;
        }
      }
      sVar6 = *(short *)((long)&p_Var18->_M_prev + 2);
      if (sVar6 != 0) {
        if (sVar6 == 1) {
          local_98[(long)p_Var21] = *(uchar *)&p_Var18->_M_prev;
          p_Var19 = (_List_node_base *)operator_new(0x38);
          p_Var19[1]._M_next = p_Var18;
          p_Var19[1]._M_prev = local_68;
          p_Var19[2]._M_next = local_60;
          p_Var19[2]._M_prev = p_Var21;
          *(ushort *)&p_Var19[3]._M_next = uVar4;
          *(byte *)((long)&p_Var19[3]._M_next + 2) = bVar16;
          *(byte *)((long)&p_Var19[3]._M_next + 3) = bVar24;
          *(undefined1 *)((long)&p_Var19[3]._M_next + 4) = 1;
          *(undefined2 *)((long)&p_Var19[3]._M_next + 5) = uVar5;
          *(undefined1 *)((long)&p_Var19[3]._M_next + 7) = uVar2;
          std::__detail::_List_node_base::_M_hook(p_Var19);
          local_80 = local_80 + 1;
          p_Var18 = p_Var18[1]._M_next;
          p_Var19 = (_List_node_base *)operator_new(0x38);
        }
        else {
          cVar3 = *(char *)&p_Var18->_M_prev;
          local_98[(long)p_Var21] = (char)uVar4 + cVar3;
          p_Var19 = (_List_node_base *)operator_new(0x38);
          cVar11 = (char)uStack_6c;
          if (uVar4 == 0) {
            bVar16 = ((char)sVar6 + cVar3) - 1;
            cVar11 = cVar3;
          }
          p_Var19[1]._M_next = p_Var18;
          p_Var19[1]._M_prev = local_68;
          p_Var19[2]._M_next = local_60;
          p_Var19[2]._M_prev = p_Var21;
          *(ushort *)&p_Var19[3]._M_next = uVar4;
          *(byte *)((long)&p_Var19[3]._M_next + 2) = bVar16;
          *(char *)((long)&p_Var19[3]._M_next + 3) = cVar11;
          *(undefined1 *)((long)&p_Var19[3]._M_next + 4) = 1;
          *(undefined2 *)((long)&p_Var19[3]._M_next + 5) = uVar5;
          *(undefined1 *)((long)&p_Var19[3]._M_next + 7) = uVar2;
          std::__detail::_List_node_base::_M_hook(p_Var19);
          local_80 = local_80 + 1;
          p_Var18 = (&(p_Var18[1]._M_next)->_M_next)[local_78];
          if (p_Var18 == (_List_node_base *)0x0) goto LAB_001e3084;
          p_Var19 = (_List_node_base *)operator_new(0x38);
        }
        p_Var19[1]._M_next = p_Var18;
        p_Var19[1]._M_prev = (_List_node_base *)0x0;
        p_Var19[2]._M_next = (_List_node_base *)0x0;
        p_Var19[2]._M_prev = (_List_node_base *)((long)&p_Var21->_M_next + 1);
        *(undefined4 *)&p_Var19[3]._M_next = 0;
        *(undefined1 *)((long)&p_Var19[3]._M_next + 4) = 0;
        std::__detail::_List_node_base::_M_hook(p_Var19);
        local_80 = local_80 + 1;
      }
LAB_001e3084:
      lVar14 = local_80;
    } while ((undefined8 ******)local_90 != &local_90);
  }
LAB_001e3444:
  local_80 = lVar14;
  free(local_98);
  ppppppuVar12 = (undefined8 ******)local_90;
  while (ppppppuVar12 != &local_90) {
    ppppppuVar10 = (undefined8 ******)*ppppppuVar12;
    operator_delete(ppppppuVar12,0x38);
    ppppppuVar12 = ppppppuVar10;
  }
  return;
}

Assistant:

void generic_mtrie_t<T>::rm (value_t *pipe_,
                             void (*func_) (prefix_t data_,
                                            size_t size_,
                                            Arg arg_),
                             Arg arg_,
                             bool call_on_uniq_)
{
    //  This used to be implemented as a non-tail recursive travesal of the trie,
    //  which means remote clients controlled the depth of the recursion and the
    //  stack size.
    //  To simulate the non-tail recursion, with post-recursion changes depending on
    //  the result of the recursive call, a stack is used to re-visit the same node
    //  and operate on it again after children have been visisted.
    //  A boolean is used to record whether the node had already been visited and to
    //  determine if the pre- or post- children visit actions have to be taken.
    //  In the case of a node with (N > 1) children, the node has to be re-visited
    //  N times, in the correct order after each child visit.
    std::list<struct iter> stack;
    unsigned char *buff = NULL;
    size_t maxbuffsize = 0;
    struct iter it = {this, NULL, NULL, 0, 0, 0, 0, false};
    stack.push_back (it);

    while (!stack.empty ()) {
        it = stack.back ();
        stack.pop_back ();

        if (!it.processed_for_removal) {
            //  Remove the subscription from this node.
            if (it.node->_pipes && it.node->_pipes->erase (pipe_)) {
                if (!call_on_uniq_ || it.node->_pipes->empty ()) {
                    func_ (buff, it.size, arg_);
                }

                if (it.node->_pipes->empty ()) {
                    LIBZMQ_DELETE (it.node->_pipes);
                }
            }

            //  Adjust the buffer.
            if (it.size >= maxbuffsize) {
                maxbuffsize = it.size + 256;
                buff =
                  static_cast<unsigned char *> (realloc (buff, maxbuffsize));
                alloc_assert (buff);
            }

            switch (it.node->_count) {
                case 0:
                    //  If there are no subnodes in the trie, we are done with this node
                    //  pre-processing.
                    break;
                case 1: {
                    //  If there's one subnode (optimisation).

                    buff[it.size] = it.node->_min;
                    //  Mark this node as pre-processed and push it, so that the next
                    //  visit after the operation on the child can do the removals.
                    it.processed_for_removal = true;
                    stack.push_back (it);
                    struct iter next = {it.node->_next.node,
                                        NULL,
                                        NULL,
                                        ++it.size,
                                        0,
                                        0,
                                        0,
                                        false};
                    stack.push_back (next);
                    break;
                }
                default: {
                    //  If there are multiple subnodes.
                    //  When first visiting this node, initialize the new_min/max parameters
                    //  which will then be used after each child has been processed, on the
                    //  post-children iterations.
                    if (it.current_child == 0) {
                        //  New min non-null character in the node table after the removal
                        it.new_min = it.node->_min + it.node->_count - 1;
                        //  New max non-null character in the node table after the removal
                        it.new_max = it.node->_min;
                    }

                    //  Mark this node as pre-processed and push it, so that the next
                    //  visit after the operation on the child can do the removals.
                    buff[it.size] = it.node->_min + it.current_child;
                    it.processed_for_removal = true;
                    stack.push_back (it);
                    if (it.node->_next.table[it.current_child]) {
                        struct iter next = {
                          it.node->_next.table[it.current_child],
                          NULL,
                          NULL,
                          it.size + 1,
                          0,
                          0,
                          0,
                          false};
                        stack.push_back (next);
                    }
                }
            }
        } else {
            //  Reset back for the next time, in case this node doesn't get deleted.
            //  This is done unconditionally, unlike when setting this variable to true.
            it.processed_for_removal = false;

            switch (it.node->_count) {
                case 0:
                    //  If there are no subnodes in the trie, we are done with this node
                    //  post-processing.
                    break;
                case 1:
                    //  If there's one subnode (optimisation).

                    //  Prune the node if it was made redundant by the removal
                    if (it.node->_next.node->is_redundant ()) {
                        LIBZMQ_DELETE (it.node->_next.node);
                        it.node->_count = 0;
                        --it.node->_live_nodes;
                        zmq_assert (it.node->_live_nodes == 0);
                    }
                    break;
                default:
                    //  If there are multiple subnodes.
                    {
                        if (it.node->_next.table[it.current_child]) {
                            //  Prune redundant nodes from the mtrie
                            if (it.node->_next.table[it.current_child]
                                  ->is_redundant ()) {
                                LIBZMQ_DELETE (
                                  it.node->_next.table[it.current_child]);

                                zmq_assert (it.node->_live_nodes > 0);
                                --it.node->_live_nodes;
                            } else {
                                //  The node is not redundant, so it's a candidate for being
                                //  the new min/max node.
                                //
                                //  We loop through the node array from left to right, so the
                                //  first non-null, non-redundant node encountered is the new
                                //  minimum index. Conversely, the last non-redundant, non-null
                                //  node encountered is the new maximum index.
                                if (it.current_child + it.node->_min
                                    < it.new_min)
                                    it.new_min =
                                      it.current_child + it.node->_min;
                                if (it.current_child + it.node->_min
                                    > it.new_max)
                                    it.new_max =
                                      it.current_child + it.node->_min;
                            }
                        }

                        //  If there are more children to visit, push again the current
                        //  node, so that pre-processing can happen on the next child.
                        //  If we are done, reset the child index so that the ::rm is
                        //  fully idempotent.
                        ++it.current_child;
                        if (it.current_child >= it.node->_count)
                            it.current_child = 0;
                        else {
                            stack.push_back (it);
                            continue;
                        }

                        //  All children have been visited and removed if needed, and
                        //  all pre- and post-visit operations have been carried.
                        //  Resize/free the node table if needed.
                        zmq_assert (it.node->_count > 1);

                        //  Free the node table if it's no longer used.
                        switch (it.node->_live_nodes) {
                            case 0:
                                free (it.node->_next.table);
                                it.node->_next.table = NULL;
                                it.node->_count = 0;
                                break;
                            case 1:
                                //  Compact the node table if possible

                                //  If there's only one live node in the table we can
                                //  switch to using the more compact single-node
                                //  representation
                                zmq_assert (it.new_min == it.new_max);
                                zmq_assert (it.new_min >= it.node->_min);
                                zmq_assert (it.new_min
                                            < it.node->_min + it.node->_count);
                                {
                                    generic_mtrie_t *node =
                                      it.node->_next
                                        .table[it.new_min - it.node->_min];
                                    zmq_assert (node);
                                    free (it.node->_next.table);
                                    it.node->_next.node = node;
                                }
                                it.node->_count = 1;
                                it.node->_min = it.new_min;
                                break;
                            default:
                                if (it.new_min > it.node->_min
                                    || it.new_max < it.node->_min
                                                      + it.node->_count - 1) {
                                    zmq_assert (it.new_max - it.new_min + 1
                                                > 1);

                                    generic_mtrie_t **old_table =
                                      it.node->_next.table;
                                    zmq_assert (it.new_min > it.node->_min
                                                || it.new_max
                                                     < it.node->_min
                                                         + it.node->_count - 1);
                                    zmq_assert (it.new_min >= it.node->_min);
                                    zmq_assert (it.new_max
                                                <= it.node->_min
                                                     + it.node->_count - 1);
                                    zmq_assert (it.new_max - it.new_min + 1
                                                < it.node->_count);

                                    it.node->_count =
                                      it.new_max - it.new_min + 1;
                                    it.node->_next.table =
                                      static_cast<generic_mtrie_t **> (
                                        malloc (sizeof (generic_mtrie_t *)
                                                * it.node->_count));
                                    alloc_assert (it.node->_next.table);

                                    memmove (it.node->_next.table,
                                             old_table
                                               + (it.new_min - it.node->_min),
                                             sizeof (generic_mtrie_t *)
                                               * it.node->_count);
                                    free (old_table);

                                    it.node->_min = it.new_min;
                                }
                        }
                    }
            }
        }
    }

    free (buff);
}